

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O2

uint32_t __thiscall pstore::header::get_crc(header *this)

{
  uint32_t uVar1;
  span<const_pstore::header::body,__1L> sVar2;
  span<const_pstore::header::body,__1L> buf;
  
  sVar2 = gsl::make_span<pstore::header::body_const>(&this->a,1);
  buf.storage_.data_ = (index_type)sVar2.storage_.data_;
  buf.storage_.super_extent_type<_1L>.size_ = buf.storage_.data_;
  uVar1 = crc32<pstore::gsl::span<pstore::header::body_const,_1l>>
                    ((pstore *)sVar2.storage_.super_extent_type<_1L>.size_.size_,buf);
  return uVar1;
}

Assistant:

std::uint32_t header::get_crc () const noexcept {
        return crc32 (::pstore::gsl::make_span (&this->a, 1));
    }